

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

void xmlRelaxNGNormExtSpace(xmlChar *value)

{
  byte *pbVar1;
  bool bVar2;
  byte *local_20;
  xmlChar *cur;
  xmlChar *start;
  xmlChar *value_local;
  
  local_20 = value;
  if (value != (xmlChar *)0x0) {
    while( true ) {
      bVar2 = true;
      if ((*local_20 != 0x20) && ((*local_20 < 9 || (bVar2 = true, 10 < *local_20)))) {
        bVar2 = *local_20 == 0xd;
      }
      if (!bVar2) break;
      local_20 = local_20 + 1;
    }
    cur = value;
    if (local_20 == value) {
      do {
        while( true ) {
          pbVar1 = local_20;
          bVar2 = false;
          if (*local_20 != 0) {
            bVar2 = true;
            if ((*local_20 != 0x20) && ((*local_20 < 9 || (bVar2 = true, 10 < *local_20)))) {
              bVar2 = *local_20 == 0xd;
            }
            bVar2 = (bool)(bVar2 ^ 1);
          }
          if (!bVar2) break;
          local_20 = local_20 + 1;
        }
        if (*local_20 == 0) {
          return;
        }
        while( true ) {
          bVar2 = true;
          if ((*local_20 != 0x20) && ((*local_20 < 9 || (bVar2 = true, 10 < *local_20)))) {
            bVar2 = *local_20 == 0xd;
          }
          if (!bVar2) break;
          local_20 = local_20 + 1;
        }
      } while (*local_20 != 0);
      *pbVar1 = 0;
    }
    else {
      while( true ) {
        while( true ) {
          bVar2 = false;
          if (*local_20 != 0) {
            bVar2 = true;
            if ((*local_20 != 0x20) && ((*local_20 < 9 || (bVar2 = true, 10 < *local_20)))) {
              bVar2 = *local_20 == 0xd;
            }
            bVar2 = (bool)(bVar2 ^ 1);
          }
          if (!bVar2) break;
          *cur = *local_20;
          local_20 = local_20 + 1;
          cur = cur + 1;
        }
        if (*local_20 == 0) {
          *cur = '\0';
          return;
        }
        while( true ) {
          bVar2 = true;
          if ((*local_20 != 0x20) && ((*local_20 < 9 || (bVar2 = true, 10 < *local_20)))) {
            bVar2 = *local_20 == 0xd;
          }
          if (!bVar2) break;
          local_20 = local_20 + 1;
        }
        if (*local_20 == 0) break;
        *cur = *local_20;
        local_20 = local_20 + 1;
        cur = cur + 1;
      }
      *cur = '\0';
    }
  }
  return;
}

Assistant:

static void
xmlRelaxNGNormExtSpace(xmlChar * value)
{
    xmlChar *start = value;
    xmlChar *cur = value;

    if (value == NULL)
        return;

    while (IS_BLANK_CH(*cur))
        cur++;
    if (cur == start) {
        do {
            while ((*cur != 0) && (!IS_BLANK_CH(*cur)))
                cur++;
            if (*cur == 0)
                return;
            start = cur;
            while (IS_BLANK_CH(*cur))
                cur++;
            if (*cur == 0) {
                *start = 0;
                return;
            }
        } while (1);
    } else {
        do {
            while ((*cur != 0) && (!IS_BLANK_CH(*cur)))
                *start++ = *cur++;
            if (*cur == 0) {
                *start = 0;
                return;
            }
            /* don't try to normalize the inner spaces */
            while (IS_BLANK_CH(*cur))
                cur++;
            if (*cur == 0) {
                *start = 0;
                return;
            }
            *start++ = *cur++;
        } while (1);
    }
}